

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O0

void spvtools::opt::anon_unknown_28::GetBlocksInPath
               (uint32_t block,uint32_t entry,
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               *blocks_in_path,CFG *cfg)

{
  bool bVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  reference puVar2;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar3;
  uint32_t local_3c;
  const_iterator cStack_38;
  uint32_t pid;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  CFG *cfg_local;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *blocks_in_path_local;
  uint32_t entry_local;
  uint32_t block_local;
  
  this = CFG::preds(cfg,block);
  __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this);
  cStack_38 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this);
  while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffc8), bVar1) {
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end2);
    local_3c = *puVar2;
    pVar3 = std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::insert(blocks_in_path,&local_3c);
    if ((((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
       (local_3c != entry)) {
      GetBlocksInPath(local_3c,entry,blocks_in_path,cfg);
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void GetBlocksInPath(uint32_t block, uint32_t entry,
                     std::unordered_set<uint32_t>* blocks_in_path,
                     const CFG& cfg) {
  for (uint32_t pid : cfg.preds(block)) {
    if (blocks_in_path->insert(pid).second) {
      if (pid != entry) {
        GetBlocksInPath(pid, entry, blocks_in_path, cfg);
      }
    }
  }
}